

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

QRgbaFloat32 *
fetchTransformedFP<(TextureBlendType)3>
          (QRgbaFloat32 *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  uchar *puVar1;
  undefined8 *puVar2;
  uchar *puVar3;
  undefined4 *puVar4;
  float fVar5;
  BPP BVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  QRgbaFloat32 *pQVar22;
  long in_FS_OFFSET;
  int iVar23;
  double dVar24;
  int iVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  uint buffer32 [2048];
  double dStack_40b0;
  double dStack_4060;
  unsigned_long_long local_4038 [2049];
  long local_30;
  
  uVar12 = (ulong)(uint)length;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  BVar6 = qPixelLayouts[(data->field_23).texture.format].bpp;
  if ((int)BVar6 < 7) {
    if (BVar6 == BPP32) {
      fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)6,unsigned_int>
                ((uint *)local_4038,data,y,x,length);
    }
    else {
      fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)0,unsigned_int>
                ((uint *)local_4038,data,y,x,length);
    }
    (*qConvertToRGBA32F[(data->field_23).texture.format])
              (buffer,(uint *)local_4038,length,(data->field_23).texture.colorTable,
               (QDitherInfo *)0x0);
    goto LAB_006786eb;
  }
  if ((int)BVar6 < 9) {
    fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)7,unsigned_long_long>
              (local_4038,data,y,x,length);
    (*convert64ToRGBA32F[(data->field_23).texture.format])(buffer,local_4038,length);
    goto LAB_006786eb;
  }
  dVar11 = (double)x + 0.5;
  dVar27 = (double)y + 0.5;
  if ((data->field_0x8a & 1) == 0) {
LAB_0067890a:
    if (0 < length) {
      dVar30 = data->m11;
      dVar9 = data->m12;
      dVar24 = data->m13;
      dVar26 = data->m23 * dVar27 + dVar11 * dVar24 + data->m33;
      dVar28 = data->dx + data->m21 * dVar27 + dVar11 * dVar30;
      dStack_4060 = data->dy + data->m22 * dVar27 + dVar11 * dVar9;
      pQVar22 = buffer;
      do {
        dVar27 = (double)(-(ulong)(dVar26 == 0.0) & 0x3ff0000000000000 |
                         ~-(ulong)(dVar26 == 0.0) & (ulong)(1.0 / dVar26));
        auVar10._8_4_ = SUB84(dStack_4060,0);
        auVar10._0_8_ = dVar28;
        auVar10._12_4_ = (int)((ulong)dStack_4060 >> 0x20);
        dVar11 = floor(dVar28 * dVar27);
        dVar27 = floor(dStack_4060 * dVar27);
        iVar25 = (int)dVar27;
        uVar7 = (data->field_23).texture.height;
        if (iVar25 < 0 || (int)uVar7 <= iVar25) {
          iVar25 = (iVar25 % (int)uVar7 >> 0x1f & uVar7) + iVar25 % (int)uVar7;
        }
        iVar23 = (int)dVar11;
        uVar7 = (data->field_23).texture.width;
        dStack_4060 = auVar10._8_8_;
        if (iVar23 < 0 || (int)uVar7 <= iVar23) {
          iVar23 = (iVar23 % (int)uVar7 >> 0x1f & uVar7) + iVar23 % (int)uVar7;
        }
        puVar1 = (data->field_23).texture.imageData +
                 (long)iVar23 * 0x10 + (long)iVar25 * (data->field_23).texture.bytesPerLine;
        uVar16 = *(undefined8 *)puVar1;
        uVar17 = *(undefined8 *)(puVar1 + 8);
        pQVar22->r = (float)(int)uVar16;
        pQVar22->g = (float)(int)((ulong)uVar16 >> 0x20);
        pQVar22->b = (float)(int)uVar17;
        pQVar22->a = (float)(int)((ulong)uVar17 >> 0x20);
        dVar28 = dVar28 + dVar30;
        dStack_4060 = dStack_4060 + dVar9;
        dVar26 = dVar26 + dVar24;
        dVar26 = (double)((ulong)dVar26 & -(ulong)(dVar26 != 0.0) |
                         ~-(ulong)(dVar26 != 0.0) & (ulong)(dVar24 + dVar26));
        pQVar22 = pQVar22 + 1;
      } while (pQVar22 < buffer + length);
    }
  }
  else {
    dVar28 = (dVar27 * data->m21 + dVar11 * data->m11 + data->dx) * 65536.0;
    dVar30 = (dVar27 * data->m22 + dVar11 * data->m12 + data->dy) * 65536.0;
    dVar24 = dVar30;
    if (dVar28 <= dVar30) {
      dVar24 = dVar28;
    }
    dVar9 = data->m11 * 65536.0;
    dVar26 = data->m12 * 65536.0;
    auVar8._8_4_ = SUB84(dVar26,0);
    auVar8._0_8_ = dVar9;
    auVar8._12_4_ = (int)((ulong)dVar26 >> 0x20);
    dVar26 = trunc(dVar9);
    dStack_40b0 = auVar8._8_8_;
    dVar31 = trunc(dStack_40b0);
    dVar29 = (double)length * dVar26 + dVar28;
    dVar31 = (double)length * dVar31 + dVar30;
    dVar26 = dVar31;
    if (dVar29 <= dVar31) {
      dVar26 = dVar29;
    }
    if (dVar24 <= dVar26) {
      dVar26 = dVar24;
    }
    if (dVar26 < -2147483648.0) goto LAB_0067890a;
    dVar24 = dVar30;
    if (dVar30 <= dVar28) {
      dVar24 = dVar28;
    }
    if (dVar31 <= dVar29) {
      dVar31 = dVar29;
    }
    if (dVar31 <= dVar24) {
      dVar31 = dVar24;
    }
    if (2147483647.0 < dVar31) goto LAB_0067890a;
    iVar23 = (int)dVar28;
    iVar25 = (int)dVar30;
    if ((int)dStack_40b0 == 0) {
      iVar25 = iVar25 >> 0x10;
      uVar7 = (data->field_23).texture.height;
      if (iVar25 < 0 || (int)uVar7 <= iVar25) {
        iVar25 = (iVar25 % (int)uVar7 >> 0x1f & uVar7) + iVar25 % (int)uVar7;
      }
      if (0 < length) {
        lVar20 = (data->field_23).texture.bytesPerLine;
        puVar1 = (data->field_23).texture.imageData;
        lVar21 = 0;
        do {
          iVar19 = iVar23 >> 0x10;
          uVar7 = (data->field_23).texture.width;
          if (iVar19 < 0 || (int)uVar7 <= iVar19) {
            iVar19 = (iVar19 % (int)uVar7 >> 0x1f & uVar7) + iVar19 % (int)uVar7;
          }
          puVar3 = puVar1 + (long)iVar19 * 0x10 + iVar25 * lVar20;
          uVar13 = *(undefined4 *)(puVar3 + 4);
          uVar14 = *(undefined4 *)(puVar3 + 8);
          uVar15 = *(undefined4 *)(puVar3 + 0xc);
          puVar4 = (undefined4 *)((long)&buffer->r + lVar21);
          *puVar4 = *(undefined4 *)puVar3;
          puVar4[1] = uVar13;
          puVar4[2] = uVar14;
          puVar4[3] = uVar15;
          iVar23 = iVar23 + (int)dVar9;
          lVar21 = lVar21 + 0x10;
        } while (uVar12 * 0x10 != lVar21);
      }
    }
    else if (0 < length) {
      lVar20 = 0;
      do {
        iVar19 = iVar23 >> 0x10;
        uVar7 = (data->field_23).texture.width;
        if (iVar19 < 0 || (int)uVar7 <= iVar19) {
          iVar19 = (iVar19 % (int)uVar7 >> 0x1f & uVar7) + iVar19 % (int)uVar7;
        }
        iVar18 = iVar25 >> 0x10;
        uVar7 = (data->field_23).texture.height;
        if (iVar18 < 0 || (int)uVar7 <= iVar18) {
          iVar18 = (iVar18 % (int)uVar7 >> 0x1f & uVar7) + iVar18 % (int)uVar7;
        }
        puVar1 = (data->field_23).texture.imageData +
                 (long)iVar19 * 0x10 + (long)iVar18 * (data->field_23).texture.bytesPerLine;
        uVar16 = *(undefined8 *)(puVar1 + 8);
        puVar2 = (undefined8 *)((long)&buffer->r + lVar20);
        *puVar2 = *(undefined8 *)puVar1;
        puVar2[1] = uVar16;
        iVar23 = iVar23 + (int)dVar9;
        iVar25 = iVar25 + (int)dStack_40b0;
        lVar20 = lVar20 + 0x10;
      } while (uVar12 * 0x10 != lVar20);
    }
  }
  if ((0 < length) && ((data->field_23).texture.format == Format_RGBA32FPx4)) {
    lVar20 = 0;
    do {
      fVar5 = *(float *)((long)&buffer->a + lVar20);
      *(ulong *)((long)&buffer->r + lVar20) =
           CONCAT44(*(float *)((long)&buffer->g + lVar20) * fVar5,
                    fVar5 * *(float *)((long)&buffer->r + lVar20));
      *(ulong *)((long)&buffer->b + lVar20) =
           CONCAT44(fVar5,*(float *)((long)&buffer->b + lVar20) * fVar5);
      lVar20 = lVar20 + 0x10;
    } while (uVar12 << 4 != lVar20);
  }
LAB_006786eb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchTransformedFP(QRgbaFloat32 *buffer, const Operator *, const QSpanData *data,
                                                      int y, int x, int length)
{
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (layout->bpp < QPixelLayout::BPP64) {
        Q_DECL_UNINITIALIZED uint buffer32[BufferSize];
        Q_ASSERT(length <= BufferSize);
        if (layout->bpp == QPixelLayout::BPP32)
            fetchTransformed_fetcher<blendType, QPixelLayout::BPP32, uint>(buffer32, data, y, x, length);
        else
            fetchTransformed_fetcher<blendType, QPixelLayout::BPPNone, uint>(buffer32, data, y, x, length);
        qConvertToRGBA32F[data->texture.format](buffer, buffer32, length, data->texture.colorTable, nullptr);
    } else if (layout->bpp < QPixelLayout::BPP32FPx4) {
        Q_DECL_UNINITIALIZED quint64 buffer64[BufferSize];
        fetchTransformed_fetcher<blendType, QPixelLayout::BPP64, quint64>(buffer64, data, y, x, length);
        convert64ToRGBA32F[data->texture.format](buffer, buffer64, length);
    } else {
        fetchTransformed_fetcher<blendType, QPixelLayout::BPP32FPx4, QRgbaFloat32>(buffer, data, y, x, length);
        if (data->texture.format == QImage::Format_RGBA32FPx4)
            convertRGBA32FToRGBA32FPM(buffer, length);
        return buffer;
    }
    return buffer;
}